

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O0

size_t c4::decode_code_point(uint8_t *buf,size_t buflen,uint32_t code)

{
  bool bVar1;
  byte bVar2;
  error_flags eVar3;
  uint in_EDX;
  ulong in_RSI;
  byte *in_RDI;
  size_t local_8;
  
  if (in_RSI < 4) {
    eVar3 = get_error_flags();
    if (((eVar3 & 1) != 0) && (bVar1 = is_debugger_attached(), bVar1)) {
      trap_instruction();
    }
    handle_error(0x3fa1ef,(char *)0x4505,"check failed: %s","buflen >= 4");
  }
  bVar2 = (byte)in_EDX;
  if (in_EDX < 0x80) {
    *in_RDI = bVar2;
    local_8 = 1;
  }
  else if (in_EDX < 0x800) {
    *in_RDI = (byte)(in_EDX >> 6) | 0xc0;
    in_RDI[1] = bVar2 & 0x3f | 0x80;
    local_8 = 2;
  }
  else if (in_EDX < 0x10000) {
    *in_RDI = (byte)(in_EDX >> 0xc) | 0xe0;
    in_RDI[1] = (byte)(in_EDX >> 6) & 0x3f | 0x80;
    in_RDI[2] = bVar2 & 0x3f | 0x80;
    local_8 = 3;
  }
  else if (in_EDX < 0x110000) {
    *in_RDI = (byte)(in_EDX >> 0x12) | 0xf0;
    in_RDI[1] = (byte)(in_EDX >> 0xc) & 0x3f | 0x80;
    in_RDI[2] = (byte)(in_EDX >> 6) & 0x3f | 0x80;
    in_RDI[3] = bVar2 & 0x3f | 0x80;
    local_8 = 4;
  }
  else {
    local_8 = 0;
  }
  return local_8;
}

Assistant:

size_t decode_code_point(uint8_t *C4_RESTRICT buf, size_t buflen, const uint32_t code)
{
    C4_UNUSED(buflen);
    C4_ASSERT(buflen >= 4);
    if (code <= UINT32_C(0x7f))
    {
        buf[0] = (uint8_t)code;
        return 1u;
    }
    else if(code <= UINT32_C(0x7ff))
    {
        buf[0] = (uint8_t)(UINT32_C(0xc0) | (code >> 6));             /* 110xxxxx */
        buf[1] = (uint8_t)(UINT32_C(0x80) | (code & UINT32_C(0x3f))); /* 10xxxxxx */
        return 2u;
    }
    else if(code <= UINT32_C(0xffff))
    {
        buf[0] = (uint8_t)(UINT32_C(0xe0) | ((code >> 12)));                  /* 1110xxxx */
        buf[1] = (uint8_t)(UINT32_C(0x80) | ((code >>  6) & UINT32_C(0x3f))); /* 10xxxxxx */
        buf[2] = (uint8_t)(UINT32_C(0x80) | ((code      ) & UINT32_C(0x3f))); /* 10xxxxxx */
        return 3u;
    }
    else if(code <= UINT32_C(0x10ffff))
    {
        buf[0] = (uint8_t)(UINT32_C(0xf0) | ((code >> 18)));                  /* 11110xxx */
        buf[1] = (uint8_t)(UINT32_C(0x80) | ((code >> 12) & UINT32_C(0x3f))); /* 10xxxxxx */
        buf[2] = (uint8_t)(UINT32_C(0x80) | ((code >>  6) & UINT32_C(0x3f))); /* 10xxxxxx */
        buf[3] = (uint8_t)(UINT32_C(0x80) | ((code      ) & UINT32_C(0x3f))); /* 10xxxxxx */
        return 4u;
    }
    return 0;
}